

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::InitPropertyStringMap(ScriptContext *this,int i)

{
  Recycler *alloc;
  PropertyStringMap *__s;
  Type *addr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&PropertyStringMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d7f97f;
  data.filename._0_4_ = 0x652;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  __s = (PropertyStringMap *)new<Memory::Recycler>(0x280,alloc,0x387914);
  memset(__s,0,0x280);
  addr = (((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings + i;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  memset((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr,0,0x280
        );
  return;
}

Assistant:

void ScriptContext::InitPropertyStringMap(int i)
    {
        this->Cache()->propertyStrings[i] = RecyclerNewStruct(GetRecycler(), PropertyStringMap);
        ClearArray(this->Cache()->propertyStrings[i]->strLen2, 80);
    }